

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::TargetTask::inputsAvailable(TargetTask *this,TaskInterface ti)

{
  bool bVar1;
  Node *pNVar2;
  Node *pNVar3;
  raw_ostream *prVar4;
  BuildSystemImpl *this_00;
  BuildSystemDelegate *pBVar5;
  void *extraout_RDX;
  TaskInterface ti_00;
  BuildValue local_2b0;
  ValueType local_240;
  Twine local_228;
  Twine local_210;
  StringRef local_1f8;
  Twine local_1e8;
  Twine local_1d0;
  Twine local_1b8;
  Twine local_1a0;
  Twine local_188;
  StringRef local_170;
  TargetTask *local_160;
  void *local_158;
  BuildSystemImpl *local_150;
  BuildSystemImpl *system;
  SmallPtrSetIteratorImpl local_138;
  Node *local_128;
  Node *missingInputNode;
  iterator __end3;
  iterator __begin3;
  SmallPtrSet<llbuild::buildsystem::Node_*,_1U> *__range3;
  raw_string_ostream inputsStream;
  string inputs;
  ValueType local_38;
  TargetTask *local_20;
  TargetTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (TargetTask *)ti.impl;
  local_20 = this;
  bVar1 = llbuild::core::TaskInterface::isCancelled((TaskInterface *)&this_local);
  if (bVar1) {
    llbuild::buildsystem::BuildValue::makeSkippedCommand();
    llbuild::buildsystem::BuildValue::toData(&local_38,(BuildValue *)((long)&inputs.field_2 + 8));
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
    llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)((long)&inputs.field_2 + 8));
  }
  else {
    bVar1 = llvm::SmallPtrSetImplBase::empty((SmallPtrSetImplBase *)&this->missingInputNodes);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&inputsStream.OS);
      llvm::raw_string_ostream::raw_string_ostream
                ((raw_string_ostream *)&__range3,(string *)&inputsStream.OS);
      join_0x00000010_0x00000000_ =
           (SmallPtrSetIteratorImpl)
           llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::begin
                     (&(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>
                     );
      _missingInputNode =
           (SmallPtrSetIteratorImpl)
           llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::end
                     (&(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>
                     );
      while( true ) {
        bVar1 = llvm::SmallPtrSetIteratorImpl::operator!=
                          ((SmallPtrSetIteratorImpl *)&__end3.super_SmallPtrSetIteratorImpl.End,
                           (SmallPtrSetIteratorImpl *)&missingInputNode);
        if (!bVar1) break;
        pNVar2 = llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>::operator*
                           ((SmallPtrSetIterator<llbuild::buildsystem::Node_*> *)
                            &__end3.super_SmallPtrSetIteratorImpl.End);
        local_128 = pNVar2;
        local_138 = (SmallPtrSetIteratorImpl)
                    llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::begin
                              (&(this->missingInputNodes).
                                super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>);
        pNVar3 = llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>::operator*
                           ((SmallPtrSetIterator<llbuild::buildsystem::Node_*> *)&local_138);
        if (pNVar2 != pNVar3) {
          llvm::raw_ostream::operator<<((raw_ostream *)&__range3,", ");
        }
        prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)&__range3,"\'");
        _system = llbuild::buildsystem::Node::getName(local_128);
        prVar4 = llvm::raw_ostream::operator<<(prVar4,_system);
        llvm::raw_ostream::operator<<(prVar4,"\'");
        llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>::operator++
                  ((SmallPtrSetIterator<llbuild::buildsystem::Node_*> *)
                   &__end3.super_SmallPtrSetIteratorImpl.End);
      }
      llvm::raw_ostream::flush((raw_ostream *)&__range3);
      local_160 = this_local;
      local_158 = ti_local.impl;
      ti_00.ctx = extraout_RDX;
      ti_00.impl = ti_local.impl;
      this_00 = getBuildSystem((anon_unknown_dwarf_26382a *)this_local,ti_00);
      local_150 = this_00;
      local_170 = BuildSystemImpl::getMainFilename(this_00);
      llvm::Twine::Twine(&local_1d0,"cannot build target \'");
      local_1f8 = llbuild::buildsystem::Target::getName(this->target);
      llvm::Twine::Twine(&local_1e8,&local_1f8);
      llvm::operator+(&local_1b8,&local_1d0,&local_1e8);
      llvm::Twine::Twine(&local_210,"\' due to missing inputs: ");
      llvm::operator+(&local_1a0,&local_1b8,&local_210);
      llvm::Twine::Twine(&local_228,(string *)&inputsStream.OS);
      llvm::operator+(&local_188,&local_1a0,&local_228);
      BuildSystemImpl::error(this_00,local_170,&local_188);
      pBVar5 = BuildSystemImpl::getDelegate(local_150);
      (*pBVar5->_vptr_BuildSystemDelegate[6])();
      llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)&__range3);
      std::__cxx11::string::~string((string *)&inputsStream.OS);
    }
    llbuild::buildsystem::BuildValue::makeTarget();
    llbuild::buildsystem::BuildValue::toData(&local_240,&local_2b0);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_240,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_240);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_2b0);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // If the build should cancel, do nothing.
    if (ti.isCancelled()) {
      ti.complete(BuildValue::makeSkippedCommand().toData());
      return;
    }

    if (!missingInputNodes.empty()) {
      std::string inputs;
      raw_string_ostream inputsStream(inputs);
      for (Node* missingInputNode : missingInputNodes) {
        if (missingInputNode != *missingInputNodes.begin()) {
          inputsStream << ", ";
        }
        inputsStream << "'" << missingInputNode->getName() << "'";
      }
      inputsStream.flush();

      // FIXME: Design the logging and status output APIs.
      auto& system = getBuildSystem(ti);
      system.error(system.getMainFilename(),
                   (Twine("cannot build target '") + target.getName() +
                    "' due to missing inputs: " + inputs));
      
      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }
    
    // Complete the task immediately.
    ti.complete(BuildValue::makeTarget().toData());
  }